

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::BindUnitErrorsTest::iterate(BindUnitErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  int local_34;
  GLuint texture_invalid;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  BindUnitErrorsTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    local_34 = 0;
    do {
      local_34 = local_34 + 1;
      cVar3 = (**(code **)(lVar6 + 0xcc8))();
    } while (cVar3 != '\0');
    (**(code **)(lVar6 + 0xc0))(0,local_34);
    bVar1 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                       "glBindTextureUnit",
                       "texture is not zero or the name of an existing texture object.");
    do {
      iVar4 = (**(code **)(lVar6 + 0x800))();
    } while (iVar4 != 0);
    if (bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult BindUnitErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Objects. */
	glw::GLuint texture_invalid = 0;

	try
	{
		/* Prepare invalid texture */
		while (gl.isTexture(++texture_invalid))
			;

		/* incomplete cube map */

		/* Check that INVALID_OPERATION error is generated if texture is not zero
		 or the name of an existing texture object. */
		gl.bindTextureUnit(0, texture_invalid);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glBindTextureUnit",
								  "texture is not zero or the name of an existing texture object.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}